

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int tlstran_listener_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  tlstran_ep *ep;
  int rv;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  ep._0_4_ = nni_stream_listener_get(*(nng_stream_listener **)((long)arg + 0x60),name,buf,szp,t);
  if ((int)ep == 9) {
    ep._0_4_ = nni_getopt(tlstran_ep_options,name,arg,buf,szp,t);
  }
  return (int)ep;
}

Assistant:

static int
tlstran_listener_get(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	int         rv;
	tlstran_ep *ep = arg;

	rv = nni_stream_listener_get(ep->listener, name, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_getopt(tlstran_ep_options, name, ep, buf, szp, t);
	}
	return (rv);
}